

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O2

bool __thiscall gjkepa2_impl::EPA::getedgedist(EPA *this,sFace *face,sSV *a,sSV *b,cbtScalar *dist)

{
  cbtVector3 *v1;
  cbtVector3 *v2;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  cbtVector3 *this_00;
  cbtScalar cVar3;
  cbtScalar cVar4;
  cbtScalar cVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  cbtVector3 cVar14;
  cbtVector3 ba;
  cbtVector3 local_40;
  undefined1 extraout_var [60];
  
  auVar13 = in_ZMM1._8_56_;
  auVar10 = in_ZMM0._8_56_;
  v1 = &b->w;
  v2 = &a->w;
  cVar14 = ::operator-(v1,v2);
  auVar11._0_8_ = cVar14.m_floats._8_8_;
  auVar11._8_56_ = auVar13;
  auVar7._0_8_ = cVar14.m_floats._0_8_;
  auVar7._8_56_ = auVar10;
  local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar7._0_16_,auVar11._0_16_);
  auVar10 = ZEXT856(local_40.m_floats._8_8_);
  cVar14 = cbtVector3::cross(&local_40,&face->n);
  auVar12._0_8_ = cVar14.m_floats._8_8_;
  auVar12._8_56_ = auVar13;
  auVar8._0_8_ = cVar14.m_floats._0_8_;
  auVar8._8_56_ = auVar10;
  auVar1 = vmovshdup_avx(auVar8._0_16_);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(auVar1._0_4_ * (a->w).m_floats[1])),auVar8._0_16_,
                           ZEXT416((uint)(a->w).m_floats[0]));
  auVar1 = vfmadd132ss_fma(auVar12._0_16_,auVar1,ZEXT416((uint)(a->w).m_floats[2]));
  if (0.0 <= auVar1._0_4_) goto LAB_00e1109c;
  cVar3 = cbtVector3::length2(&local_40);
  auVar2 = vfmadd231ss_fma(ZEXT416((uint)(local_40.m_floats[1] * (a->w).m_floats[1])),
                           ZEXT416((uint)local_40.m_floats[0]),ZEXT416((uint)(a->w).m_floats[0]));
  auVar2 = vfmadd231ss_fma(auVar2,ZEXT416((uint)local_40.m_floats[2]),
                           ZEXT416((uint)(a->w).m_floats[2]));
  this_00 = v2;
  if (auVar2._0_4_ <= 0.0) {
    auVar2 = vfmadd132ss_fma(ZEXT416((uint)local_40.m_floats[0]),
                             ZEXT416((uint)(local_40.m_floats[1] * (b->w).m_floats[1])),
                             ZEXT416((uint)(b->w).m_floats[0]));
    auVar2 = vfmadd132ss_fma(ZEXT416((uint)local_40.m_floats[2]),auVar2,
                             ZEXT416((uint)(b->w).m_floats[2]));
    this_00 = v1;
    if (auVar2._0_4_ < 0.0) goto LAB_00e11037;
    cVar4 = cbtVector3::dot(v2,v1);
    cVar5 = cbtVector3::length2(v2);
    auVar9._0_4_ = cbtVector3::length2(v1);
    auVar9._4_60_ = extraout_var;
    auVar2 = vfmsub231ss_fma(ZEXT416((uint)(cVar4 * cVar4)),auVar9._0_16_,ZEXT416((uint)cVar5));
    auVar6._0_4_ = auVar2._0_4_ / cVar3;
    auVar6._4_12_ = auVar2._4_12_;
    auVar2 = vmaxss_avx(auVar6,ZEXT416(0));
    auVar2 = vsqrtss_avx(auVar2,auVar2);
    cVar3 = auVar2._0_4_;
  }
  else {
LAB_00e11037:
    cVar3 = cbtVector3::length(this_00);
  }
  *dist = cVar3;
LAB_00e1109c:
  return auVar1._0_4_ < 0.0;
}

Assistant:

bool getedgedist(sFace* face, sSV* a, sSV* b, cbtScalar& dist)
	{
		const cbtVector3 ba = b->w - a->w;
		const cbtVector3 n_ab = cbtCross(ba, face->n);   // Outward facing edge normal direction, on triangle plane
		const cbtScalar a_dot_nab = cbtDot(a->w, n_ab);  // Only care about the sign to determine inside/outside, so not normalization required

		if (a_dot_nab < 0)
		{
			// Outside of edge a->b

			const cbtScalar ba_l2 = ba.length2();
			const cbtScalar a_dot_ba = cbtDot(a->w, ba);
			const cbtScalar b_dot_ba = cbtDot(b->w, ba);

			if (a_dot_ba > 0)
			{
				// Pick distance vertex a
				dist = a->w.length();
			}
			else if (b_dot_ba < 0)
			{
				// Pick distance vertex b
				dist = b->w.length();
			}
			else
			{
				// Pick distance to edge a->b
				const cbtScalar a_dot_b = cbtDot(a->w, b->w);
				dist = cbtSqrt(cbtMax((a->w.length2() * b->w.length2() - a_dot_b * a_dot_b) / ba_l2, (cbtScalar)0));
			}

			return true;
		}

		return false;
	}